

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_soft_max_ext_back_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float scale,float max_bias,_Bool inplace)

{
  ggml_tensor *pgVar1;
  byte in_CL;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int32_t in_XMM0_Da;
  int32_t in_XMM1_Da;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  
  if ((in_CL & 1) == 0) {
    pgVar1 = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    pgVar1 = ggml_view_tensor((ggml_context *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
                              (ggml_tensor *)
                              (CONCAT17(in_CL,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff));
  }
  pgVar1->op = GGML_OP_SOFT_MAX_BACK;
  pgVar1->src[0] = in_RSI;
  pgVar1->src[1] = in_RDX;
  pgVar1->op_params[0] = in_XMM0_Da;
  pgVar1->op_params[1] = in_XMM1_Da;
  return pgVar1;
}

Assistant:

static struct ggml_tensor * ggml_soft_max_ext_back_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 scale,
        float                 max_bias,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op     = GGML_OP_SOFT_MAX_BACK;
    result->src[0] = a;
    result->src[1] = b;

    memcpy((float *) result->op_params + 0, &scale,    sizeof(float));
    memcpy((float *) result->op_params + 1, &max_bias, sizeof(float));

    return result;
}